

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drawrend.cpp
# Opt level: O0

void __thiscall CGL::DrawRend::keyboard_event(DrawRend *this,int key,int event,uchar mods)

{
  size_type sVar1;
  __type _Var2;
  __type _Var3;
  int local_b0;
  allocator<CGL::DrawRend::SampleBuffer> local_a9;
  int i_1;
  undefined1 local_88 [8];
  vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>
  samplebuffer_row_1;
  int i;
  allocator<CGL::DrawRend::SampleBuffer> local_59;
  SampleBuffer local_58;
  undefined1 local_38 [8];
  vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_> samplebuffer_row
  ;
  uchar mods_local;
  int event_local;
  int key_local;
  DrawRend *this_local;
  
  if (event == 1) {
    samplebuffer_row.
    super__Vector_base<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = mods;
    if (((key < 0x31) || (0x39 < key)) ||
       (sVar1 = std::vector<CGL::SVG_*,_std::allocator<CGL::SVG_*>_>::size(&this->svgs),
       sVar1 <= (ulong)(long)(key + -0x31))) {
      switch(key) {
      case 0x20:
        view_init(this);
        redraw(this);
        break;
      default:
        break;
      case 0x2d:
        if (1 < this->sample_rate) {
          _Var2 = std::sqrt<int>(this->sample_rate);
          _Var3 = std::sqrt<int>(this->sample_rate);
          this->sample_rate = (int)((double)(int)(_Var2 - 1.0) * (_Var3 - 1.0));
          std::
          vector<std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>,_std::allocator<std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>_>_>
          ::clear(&this->samplebuffer);
          sVar1 = this->width;
          _Var2 = std::sqrt<int>(this->sample_rate);
          SampleBuffer::SampleBuffer
                    ((SampleBuffer *)&i_1,
                     (long)_Var2 | (long)(_Var2 - 9.223372036854776e+18) & (long)_Var2 >> 0x3f);
          std::allocator<CGL::DrawRend::SampleBuffer>::allocator(&local_a9);
          std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>::
          vector((vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>
                  *)local_88,sVar1,(SampleBuffer *)&i_1,&local_a9);
          std::allocator<CGL::DrawRend::SampleBuffer>::~allocator(&local_a9);
          SampleBuffer::~SampleBuffer((SampleBuffer *)&i_1);
          for (local_b0 = 0; (ulong)(long)local_b0 < this->height; local_b0 = local_b0 + 1) {
            std::
            vector<std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>,_std::allocator<std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>_>_>
            ::push_back(&this->samplebuffer,(value_type *)local_88);
          }
          redraw(this);
          std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>::
          ~vector((vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>
                   *)local_88);
        }
        break;
      case 0x3d:
        if (this->sample_rate < 0x10) {
          _Var2 = std::sqrt<int>(this->sample_rate);
          _Var3 = std::sqrt<int>(this->sample_rate);
          this->sample_rate = (int)((double)(int)(_Var2 + 1.0) * (_Var3 + 1.0));
          std::
          vector<std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>,_std::allocator<std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>_>_>
          ::clear(&this->samplebuffer);
          sVar1 = this->width;
          _Var2 = std::sqrt<int>(this->sample_rate);
          SampleBuffer::SampleBuffer
                    (&local_58,
                     (long)_Var2 | (long)(_Var2 - 9.223372036854776e+18) & (long)_Var2 >> 0x3f);
          std::allocator<CGL::DrawRend::SampleBuffer>::allocator(&local_59);
          std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>::
          vector((vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>
                  *)local_38,sVar1,&local_58,&local_59);
          std::allocator<CGL::DrawRend::SampleBuffer>::~allocator(&local_59);
          SampleBuffer::~SampleBuffer(&local_58);
          for (samplebuffer_row_1.
               super__Vector_base<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
              (ulong)(long)(int)samplebuffer_row_1.
                                super__Vector_base<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage < this->height;
              samplebuffer_row_1.
              super__Vector_base<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
                   (int)samplebuffer_row_1.
                        super__Vector_base<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
            std::
            vector<std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>,_std::allocator<std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>_>_>
            ::push_back(&this->samplebuffer,(value_type *)local_38);
          }
          redraw(this);
          std::vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>::
          ~vector((vector<CGL::DrawRend::SampleBuffer,_std::allocator<CGL::DrawRend::SampleBuffer>_>
                   *)local_38);
        }
        break;
      case 0x4c:
        this->lsm = (int)(this->lsm + L_NEAREST) % 3;
        redraw(this);
        break;
      case 0x50:
        this->psm = (int)(this->psm + P_LINEAR) % 2;
        redraw(this);
        break;
      case 0x53:
        write_screenshot(this);
        break;
      case 0x5a:
        this->show_zoom = (this->show_zoom + 1) % 2;
      }
    }
    else {
      this->current_svg = (long)(key + -0x31);
      redraw(this);
    }
  }
  return;
}

Assistant:

void DrawRend::keyboard_event( int key, int event, unsigned char mods ) {
  if (event != EVENT_PRESS)
    return;

  // tab through the loaded files
  if (key >= '1' && key <= '9' && key-'1' < svgs.size()) {
    current_svg = key - '1';
    redraw();
    return;
  }

  switch( key ) {

    // reset view transformation
    case ' ':
      view_init();
      redraw();
      break;

    // set the sampling rate to 1, 4, 9, or 16
    case '=':
      if (sample_rate < 16) {
        sample_rate = (int)(sqrt(sample_rate)+1)*(sqrt(sample_rate)+1);

        samplebuffer.clear();
        vector<SampleBuffer> samplebuffer_row(width, SampleBuffer(sqrt(sample_rate)));
        for (int i = 0; i < height; ++i)
          samplebuffer.push_back(samplebuffer_row);
        redraw();
      }
      break;
    case '-':
      if (sample_rate > 1) {
        sample_rate = (int)(sqrt(sample_rate)-1)*(sqrt(sample_rate)-1);

        samplebuffer.clear();
        vector<SampleBuffer> samplebuffer_row(width, SampleBuffer(sqrt(sample_rate)));
        for (int i = 0; i < height; ++i)
          samplebuffer.push_back(samplebuffer_row);
        redraw();
      }
      break;

    // save the current buffer to disk
    case 'S':
      write_screenshot();
      break;

    // toggle pixel sampling scheme
    case 'P':
      psm = (PixelSampleMethod)((psm+1)%2);
      redraw();
      break;
    // toggle level sampling scheme
    case 'L':
      lsm = (LevelSampleMethod)((lsm+1)%3);
      redraw();
      break;

    // toggle zoom
    case 'Z':
      show_zoom = (show_zoom+1)%2;
      break;

    default:
      return;
  }
}